

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O3

void __thiscall csv::CSVReader::trim_header(CSVReader *this)

{
  ThreadSafeDeque<csv::CSVRow> *this_00;
  element_type *peVar1;
  int iVar2;
  int iVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  CSVRow local_78;
  CSVRow local_50;
  
  if (this->header_trimmed == false) {
    iVar2 = (this->_format).header;
    if (-1 < iVar2) {
      iVar3 = -1;
      do {
        this_00 = (this->records)._M_t.
                  super___uniq_ptr_impl<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
                  .super__Head_base<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_false>.
                  _M_head_impl;
        if (((iterator *)
            ((long)&(this_00->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_> +
            0x30))->_M_cur ==
            ((iterator *)
            ((long)&(this_00->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_> +
            0x10))->_M_cur) break;
        iVar3 = iVar3 + 1;
        if ((iVar3 == iVar2) &&
           (peVar1 = (this->col_names).
                     super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           , (peVar1->col_names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (peVar1->col_names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) {
          internals::ThreadSafeDeque<csv::CSVRow>::pop_front(&local_78,this_00);
          CSVRow::operator_cast_to_vector(&local_90,&local_78);
          internals::ColNames::set_col_names
                    ((this->col_names).
                     super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     ,&local_90);
          this->n_cols = (long)local_90.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_90.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_90);
          this_01._M_pi =
               local_78.data.
               super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        }
        else {
          internals::ThreadSafeDeque<csv::CSVRow>::pop_front(&local_50,this_00);
          this_01._M_pi =
               local_50.data.
               super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        }
        if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
        }
        iVar2 = (this->_format).header;
      } while (iVar3 < iVar2);
    }
    this->header_trimmed = true;
  }
  return;
}

Assistant:

CSV_INLINE void CSVReader::trim_header() {
        if (!this->header_trimmed) {
            for (int i = 0; i <= this->_format.header && !this->records->empty(); i++) {
                if (i == this->_format.header && this->col_names->empty()) {
                    this->set_col_names(this->records->pop_front());
                }
                else {
                    this->records->pop_front();
                }
            }

            this->header_trimmed = true;
        }
    }